

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SerialAnalyzerResults::GenerateBubbleText
          (SerialAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  char local_168 [8];
  char result_str [128];
  char local_d8 [8];
  char number_str [128];
  U32 bits_per_transfer;
  bool parity_error;
  bool framing_error;
  Frame frame;
  ulonglong local_40;
  byte local_2f;
  DisplayBase display_base_local;
  Channel *param_2_local;
  U64 frame_index_local;
  SerialAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)&bits_per_transfer);
  number_str[0x7f] = (local_2f & 1) != 0;
  number_str[0x7e] = (local_2f & 2) != 0;
  number_str._120_4_ = this->mSettings->mBitsPerTransfer;
  if (this->mSettings->mSerialMode != Normal) {
    number_str._120_4_ = number_str._120_4_ - 1;
  }
  AnalyzerHelpers::GetNumberString(local_40,display_base,number_str._120_4_,local_d8,0x80);
  if ((local_2f & 4) == 0) {
    if (((number_str[0x7e] & 1U) == 1) || ((number_str[0x7f] & 1U) == 1)) {
      AnalyzerResults::AddResultString
                ((char *)this,"!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      snprintf(local_168,0x80,"%s (error)",local_d8);
      AnalyzerResults::AddResultString
                ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((number_str[0x7f] & 1U) == 0) {
        snprintf(local_168,0x80,"%s (parity error)",local_d8);
      }
      else if ((number_str[0x7e] & 1U) == 0) {
        snprintf(local_168,0x80,"%s (framing error)",local_d8);
      }
      else {
        snprintf(local_168,0x80,"%s (framing error & parity error)",local_d8);
      }
      AnalyzerResults::AddResultString
                ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,local_d8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerResults::AddResultString
              ((char *)this,"A",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Addr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if ((number_str[0x7f] & 1U) == 0) {
      snprintf(local_168,0x80,"Addr: %s",local_d8);
      AnalyzerResults::AddResultString
                ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      snprintf(local_168,0x80,"Address: %s",local_d8);
      AnalyzerResults::AddResultString
                ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      snprintf(local_168,0x80,"Addr: %s (framing error)",local_d8);
      AnalyzerResults::AddResultString
                ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      snprintf(local_168,0x80,"Address: %s (framing error)",local_d8);
      AnalyzerResults::AddResultString
                ((char *)this,local_168,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  Frame::~Frame((Frame *)&bits_per_transfer);
  return;
}

Assistant:

void SerialAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                                DisplayBase display_base ) // unreferenced vars commented out to remove warnings.
{
    // we only need to pay attention to 'channel' if we're making bubbles for more than one channel (as set by
    // AddChannelBubblesWillAppearOn)
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    bool framing_error = false;
    if( ( frame.mFlags & FRAMING_ERROR_FLAG ) != 0 )
        framing_error = true;

    bool parity_error = false;
    if( ( frame.mFlags & PARITY_ERROR_FLAG ) != 0 )
        parity_error = true;

    U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        bits_per_transfer--;

    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, bits_per_transfer, number_str, 128 );

    char result_str[ 128 ];

    // MP mode address case:
    if( ( frame.mFlags & MP_MODE_ADDRESS_FLAG ) != 0 )
    {
        AddResultString( "A" );
        AddResultString( "Addr" );

        if( framing_error == false )
        {
            snprintf( result_str, sizeof( result_str ), "Addr: %s", number_str );
            AddResultString( result_str );

            snprintf( result_str, sizeof( result_str ), "Address: %s", number_str );
            AddResultString( result_str );
        }
        else
        {
            snprintf( result_str, sizeof( result_str ), "Addr: %s (framing error)", number_str );
            AddResultString( result_str );

            snprintf( result_str, sizeof( result_str ), "Address: %s (framing error)", number_str );
            AddResultString( result_str );
        }
        return;
    }

    // normal case:
    if( ( parity_error == true ) || ( framing_error == true ) )
    {
        AddResultString( "!" );

        snprintf( result_str, sizeof( result_str ), "%s (error)", number_str );
        AddResultString( result_str );

        if( framing_error == false )
            snprintf( result_str, sizeof( result_str ), "%s (parity error)", number_str );
        else if( parity_error == false )
            snprintf( result_str, sizeof( result_str ), "%s (framing error)", number_str );
        else
            snprintf( result_str, sizeof( result_str ), "%s (framing error & parity error)", number_str );

        AddResultString( result_str );
    }
    else
    {
        AddResultString( number_str );
    }
}